

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O3

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::set_double_click_handler
          (list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this,any_function<void_(unsigned_long),_void,_1UL> *eh)

{
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = (this->super_scrollable_region).super_drawable.m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  any_function<void_(unsigned_long),_void,_1UL>::operator=(&this->event_handler,eh);
  auto_mutex::unlock(&local_28);
  return;
}

Assistant:

void set_double_click_handler (
            const any_function<void(unsigned long)>& eh
        ) { auto_mutex M(m); event_handler = eh; }